

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  long lVar1;
  GLFWbool GVar2;
  _func_void__GLFWwindow_ptr_GLFWbool *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/window.c",
                  0x37d,"void glfwSetWindowAttrib(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  uVar3 = (uint)(value != 0);
  GVar2 = SUB14(value != 0,0);
  switch(attrib) {
  case 0x20003:
    *(uint *)(handle + 8) = uVar3;
    UNRECOVERED_JUMPTABLE = _glfw.platform.setWindowResizable;
    if (*(long *)(handle + 0x50) != 0) {
      return;
    }
    goto LAB_00144a9e;
  case 0x20004:
  case 0x20008:
  case 0x20009:
  case 0x2000a:
  case 0x2000b:
switchD_001449f8_caseD_20004:
    _glfwInputError(0x10003,"Invalid window attribute 0x%08X",attrib);
    return;
  case 0x20005:
    *(uint *)(handle + 0xc) = uVar3;
    if (*(long *)(handle + 0x50) == 0) {
      (*_glfw.platform.setWindowDecorated)((_GLFWwindow *)handle,GVar2);
    }
    break;
  case 0x20006:
    *(uint *)(handle + 0x10) = uVar3;
    return;
  case 0x20007:
    *(uint *)(handle + 0x14) = uVar3;
    lVar1 = *(long *)(handle + 0x50);
    UNRECOVERED_JUMPTABLE = _glfw.platform.setWindowFloating;
    goto joined_r0x00144a5f;
  case 0x2000c:
    *(uint *)(handle + 0x18) = uVar3;
    return;
  case 0x2000d:
    *(uint *)(handle + 0x1c) = uVar3;
    UNRECOVERED_JUMPTABLE = _glfw.platform.setWindowMousePassthrough;
    goto LAB_00144a9e;
  default:
    if (attrib != 0xc2000d) goto switchD_001449f8_caseD_20004;
  }
  if (_glfw.hints.window.titlebar != uVar3) {
    lVar1 = *(long *)(handle + 0x50);
    UNRECOVERED_JUMPTABLE = _glfw.platform.setWindowTitleBar;
    _glfw.hints.window.titlebar = uVar3;
joined_r0x00144a5f:
    if (lVar1 == 0) {
LAB_00144a9e:
      (*UNRECOVERED_JUMPTABLE)((_GLFWwindow *)handle,GVar2);
      return;
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    switch (attrib)
    {
        case GLFW_AUTO_ICONIFY:
            window->autoIconify = value;
            return;

        case GLFW_RESIZABLE:
            window->resizable = value;
            if (!window->monitor)
                _glfw.platform.setWindowResizable(window, value);
            return;

        case GLFW_DECORATED:
            window->decorated = value;
            if (!window->monitor)
                _glfw.platform.setWindowDecorated(window, value);
		case GLFW_TITLEBAR:
			if (_glfw.hints.window.titlebar == value)
            	return;

            _glfw.hints.window.titlebar = value;
    	    if (!window->monitor)
                _glfw.platform.setWindowTitleBar(window, value);
            return;
        case GLFW_FLOATING:
            window->floating = value;
            if (!window->monitor)
                _glfw.platform.setWindowFloating(window, value);
            return;

        case GLFW_FOCUS_ON_SHOW:
            window->focusOnShow = value;
            return;

        case GLFW_MOUSE_PASSTHROUGH:
            window->mousePassthrough = value;
            _glfw.platform.setWindowMousePassthrough(window, value);
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}